

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::removeScaleFactorsByPartition
          (BeagleCPUImpl<double,_1,_0> *this,int *scalingIndices,int count,
          int cumulativeScalingIndex,int partitionIndex)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  int j;
  long lVar6;
  double __x;
  
  iVar1 = this->gPatternPartitionsStartPatterns[partitionIndex];
  iVar2 = this->gPatternPartitionsStartPatterns[(long)partitionIndex + 1];
  pdVar3 = this->gScaleBuffers[cumulativeScalingIndex];
  for (uVar5 = 0; uVar5 != (uint)(~(count >> 0x1f) & count); uVar5 = uVar5 + 1) {
    pdVar4 = this->gScaleBuffers[scalingIndices[uVar5]];
    for (lVar6 = (long)iVar1; lVar6 < iVar2; lVar6 = lVar6 + 1) {
      __x = pdVar4[lVar6];
      if ((this->kFlags & 0x400) == 0) {
        __x = log(__x);
      }
      pdVar3[lVar6] = pdVar3[lVar6] - __x;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::removeScaleFactorsByPartition(const int* scalingIndices,
                                                                     int count,
                                                                     int cumulativeScalingIndex,
                                                                     int partitionIndex) {

    int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
    int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

    REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
    for(int i=0; i<count; i++) {
        const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
        for(int j=startPattern; j<endPattern; j++) {
            if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                cumulativeScaleBuffer[j] -= scaleBuffer[j];
            else
                cumulativeScaleBuffer[j] -= log(scaleBuffer[j]);
        }
    }

    return BEAGLE_SUCCESS;
}